

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>::on_hex
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char cVar1;
  basic_format_specs<char> *specs;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  char *digits;
  ulong __n;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  ptrdiff_t _Num;
  string_view prefix;
  write_int_data<char> data;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  buffer<char> *pbVar12;
  write_int_data<char> local_40;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar6 = this->prefix_size;
    this->prefix_size = uVar6 + 1;
    this->prefix[uVar6] = '0';
    cVar1 = specs->type;
    uVar6 = this->prefix_size;
    this->prefix_size = uVar6 + 1;
    this->prefix[uVar6] = cVar1;
  }
  lVar10 = 0;
  uVar6 = this->abs_value;
  do {
    lVar10 = lVar10 + 1;
    bVar3 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
  } while (bVar3);
  pbVar12 = (this->out).container;
  __n = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_40,(int)lVar10,prefix,specs);
  uVar4 = (ulong)specs->width;
  if (-1 < (long)uVar4) {
    uVar11 = 0;
    if (local_40.size <= uVar4) {
      uVar11 = uVar4 - local_40.size;
    }
    uVar4 = uVar11 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar2 = pbVar12->size_;
    uVar8 = local_40.size + sVar2 + (specs->fill).size_ * uVar11;
    if (pbVar12->capacity_ < uVar8) {
      (**pbVar12->_vptr_buffer)(pbVar12,uVar8);
    }
    pbVar12->size_ = uVar8;
    pcVar5 = fill<char*,char>(pbVar12->ptr_ + sVar2,uVar4,&specs->fill);
    if (__n != 0) {
      memmove(pcVar5,this->prefix,__n);
      pcVar5 = pcVar5 + __n;
    }
    pcVar9 = pcVar5;
    if (local_40.padding != 0) {
      pcVar9 = pcVar5 + local_40.padding;
      memset(pcVar5,0x30,local_40.padding);
    }
    pcVar5 = "0123456789ABCDEF";
    if (this->specs->type == 'x') {
      pcVar5 = "0123456789abcdef";
    }
    pcVar7 = pcVar9 + lVar10;
    uVar6 = this->abs_value;
    do {
      pcVar7 = pcVar7 + -1;
      *pcVar7 = pcVar5[uVar6 & 0xf];
      bVar3 = 0xf < uVar6;
      uVar6 = uVar6 >> 4;
    } while (bVar3);
    fill<char*,char>(pcVar9 + lVar10,uVar11 - uVar4,&specs->fill);
    (this->out).container = pbVar12;
    return;
  }
  assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }